

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall TTD::SnapshotExtractor::SnapshotExtractor(SnapshotExtractor *this)

{
  SnapshotExtractor *this_local;
  
  MarkTable::MarkTable(&this->m_marks);
  JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Queue
            (&this->m_worklist,&Memory::HeapAllocator::Instance);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::TTDIdentifierDictionary
            (&this->m_idToHandlerMap);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::TTDIdentifierDictionary
            (&this->m_idToTypeMap);
  this->m_pendingSnap = (SnapShot *)0x0;
  this->m_snapshotsTakenCount = 0;
  this->m_totalMarkMillis = 0.0;
  this->m_totalExtractMillis = 0.0;
  this->m_maxMarkMillis = 0.0;
  this->m_maxExtractMillis = 0.0;
  this->m_lastMarkMillis = 0.0;
  this->m_lastExtractMillis = 0.0;
  return;
}

Assistant:

SnapshotExtractor::SnapshotExtractor()
        : m_marks(), m_worklist(&HeapAllocator::Instance),
        m_idToHandlerMap(), m_idToTypeMap(),
        m_pendingSnap(nullptr),
        m_snapshotsTakenCount(0),
        m_totalMarkMillis(0.0), m_totalExtractMillis(0.0),
        m_maxMarkMillis(0.0), m_maxExtractMillis(0.0),
        m_lastMarkMillis(0.0), m_lastExtractMillis(0.0)
    {
        ;
    }